

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall fasttext::Args::printTrainingHelp(Args *this)

{
  ostream *poVar1;
  char *pcVar2;
  string local_58;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nThe following arguments for training are optional:\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"  -lr                 learning rate [",0x25);
  poVar1 = std::ostream::_M_insert<double>(this->lr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -lrUpdateRate       change the rate of updates for the learning rate [",0x48)
  ;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->lrUpdateRate);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -dim                size of word vectors [",0x2c);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->dim);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -ws                 size of the context window [",0x32);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->ws);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -epoch              number of epochs [",0x28);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->epoch);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -neg                number of negatives sampled [",0x33);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->neg);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  pcVar2 = "  -loss               loss function {ns, hs, softmax} [";
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -loss               loss function {ns, hs, softmax} [",0x37);
  lossToString_abi_cxx11_(&local_38,(Args *)pcVar2,this->loss);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -thread             number of threads [",0x29);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->thread);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -pretrainedVectors  pretrained word vectors for supervised learning [",0x47);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->pretrainedVectors)._M_dataplus._M_p,
                      (this->pretrainedVectors)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  pcVar2 = "  -saveOutput         whether output params should be saved [";
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -saveOutput         whether output params should be saved [",0x3d);
  boolToString_abi_cxx11_(&local_58,(Args *)pcVar2,this->saveOutput);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Args::printTrainingHelp() {
  std::cerr
    << "\nThe following arguments for training are optional:\n"
    << "  -lr                 learning rate [" << lr << "]\n"
    << "  -lrUpdateRate       change the rate of updates for the learning rate [" << lrUpdateRate << "]\n"
    << "  -dim                size of word vectors [" << dim << "]\n"
    << "  -ws                 size of the context window [" << ws << "]\n"
    << "  -epoch              number of epochs [" << epoch << "]\n"
    << "  -neg                number of negatives sampled [" << neg << "]\n"
    << "  -loss               loss function {ns, hs, softmax} [" << lossToString(loss) << "]\n"
    << "  -thread             number of threads [" << thread << "]\n"
    << "  -pretrainedVectors  pretrained word vectors for supervised learning ["<< pretrainedVectors <<"]\n"
    << "  -saveOutput         whether output params should be saved [" << boolToString(saveOutput) << "]\n";
}